

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall Shell::Options::output(Options *this,ostream *str)

{
  Iterator it;
  Iterator i2;
  IterTraits<Lib::CatIterator<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator,_Lib::IterTraits<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator>_>_>
  it_00;
  Iterator i1;
  AbstractOptionValue *pAVar1;
  bool bVar2;
  byte bVar3;
  Stack<Shell::Options::AbstractOptionValue_*> *pSVar4;
  ostream *poVar5;
  ulong uVar6;
  void *this_00;
  Stack<Shell::Options::AbstractOptionValue_*> *in_RSI;
  Options *in_RDI;
  Iterator oit;
  DArray<Shell::Options::AbstractOptionValue_*> osa;
  Stack<Shell::Options::AbstractOptionValue_*> os;
  string br_gap;
  string br;
  string label;
  int i_1;
  uint tag;
  AbstractOptionValue *option_1;
  Stack<Shell::Options::AbstractOptionValue_*> stack;
  int i;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> groups;
  int num_tags;
  VirtualIterator<Shell::Options::AbstractOptionValue_*> options;
  Mode this_mode;
  bool experimental;
  bool normalshow;
  stringstream vs;
  string first;
  VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sit;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim_l;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim_s;
  ValueNotFoundException *anon_var_0_1;
  ValueNotFoundException *anon_var_0;
  string name;
  AbstractOptionValue *option;
  Options *in_stack_fffffffffffff978;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *in_stack_fffffffffffff980;
  AbstractOptionValue *in_stack_fffffffffffff988;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *in_stack_fffffffffffff990;
  Stack<Shell::Options::AbstractOptionValue_*> *in_stack_fffffffffffff998;
  Stack<Shell::Options::AbstractOptionValue_*> *in_stack_fffffffffffff9a0;
  AbstractOptionValue *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  Stack<Shell::Options::AbstractOptionValue_*> *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d8;
  LookupWrapper *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa20;
  string *psVar7;
  Options *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  Iterator local_528 [2];
  DArray<Shell::Options::AbstractOptionValue_*> local_500 [2];
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  int local_420;
  OptionTag local_41c;
  AbstractOptionValue *local_418;
  int local_3cc;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> local_3c8;
  int local_3a4;
  Mode local_398;
  byte local_392;
  byte local_391;
  string local_390 [32];
  stringstream local_370 [16];
  undefined1 local_360 [376];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [64];
  Options *local_168;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *pSStack_160;
  AbstractOptionValue *local_158;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *pSStack_150;
  Stack<Shell::Options::AbstractOptionValue_*> *local_148;
  string local_138 [64];
  string local_f8 [128];
  string local_78 [32];
  string local_58 [32];
  AbstractOptionValue *local_38;
  string local_30 [32];
  Stack<Shell::Options::AbstractOptionValue_*> *local_10;
  
  local_10 = in_RSI;
  bVar2 = printAllTheoryAxioms(in_RDI);
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Sorry, not implemented yet!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    explainOption_abi_cxx11_(in_stack_fffffffffffff978);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_30);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      explainOption_abi_cxx11_(in_stack_fffffffffffff978);
      std::__cxx11::string::string(local_78,local_58);
      local_38 = LookupWrapper::findLong(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      std::__cxx11::string::~string(local_78);
      if (local_38 == (AbstractOptionValue *)0x0) {
        poVar5 = std::operator<<((ostream *)local_10,local_58);
        poVar5 = std::operator<<(poVar5," not a known option");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_f8,local_58);
        getSimilarOptionNames
                  (in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                   (bool)in_stack_fffffffffffffa1f);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::string(local_138,local_58);
        getSimilarOptionNames
                  (in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                   (bool)in_stack_fffffffffffffa1f);
        std::__cxx11::string::~string(local_138);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Iterator::Iterator
                  ((Iterator *)in_stack_fffffffffffff980,
                   (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff978);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Iterator::Iterator
                  ((Iterator *)in_stack_fffffffffffff980,
                   (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff978);
        i1.super_RefIterator._pointer._7_1_ = in_stack_fffffffffffffa1f;
        i1.super_RefIterator._pointer._0_7_ = in_stack_fffffffffffffa18;
        i1.super_RefIterator._stack = in_stack_fffffffffffffa20;
        i2.super_RefIterator._stack = in_stack_fffffffffffffa10;
        i2.super_RefIterator._pointer = in_stack_fffffffffffffa08;
        Lib::
        concatIters<Lib::Stack<std::__cxx11::string>::Iterator,Lib::Stack<std::__cxx11::string>::Iterator>
                  (i1,i2);
        it_00._iter._it1.super_RefIterator._pointer._0_7_ = in_stack_fffffffffffffa18;
        it_00._iter._0_8_ = in_stack_fffffffffffffa10;
        it_00._iter._it1.super_RefIterator._pointer._7_1_ = in_stack_fffffffffffffa1f;
        it_00._iter._it1.super_RefIterator._stack = in_stack_fffffffffffffa20;
        it_00._iter._it2._iter.super_RefIterator._pointer =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28;
        it_00._iter._it2._iter.super_RefIterator._stack._0_7_ = in_stack_fffffffffffffa30;
        it_00._iter._it2._iter.super_RefIterator._stack._7_1_ = in_stack_fffffffffffffa37;
        Lib::
        pvi<Lib::IterTraits<Lib::CatIterator<Lib::Stack<std::__cxx11::string>::Iterator,Lib::IterTraits<Lib::Stack<std::__cxx11::string>::Iterator>>>>
                  (it_00);
        bVar2 = Lib::
                VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0xc352fa);
        in_stack_fffffffffffff978 = local_168;
        in_stack_fffffffffffff980 = pSStack_160;
        in_stack_fffffffffffff988 = local_158;
        in_stack_fffffffffffff990 = pSStack_150;
        in_stack_fffffffffffff998 = local_148;
        if (bVar2) {
          Lib::
          VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::next((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_168);
          std::operator<<((ostream *)local_10,"\tMaybe you meant ");
          bVar2 = Lib::
                  VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0xc3534d);
          in_stack_fffffffffffff978 = local_168;
          in_stack_fffffffffffff980 = pSStack_160;
          in_stack_fffffffffffff988 = local_158;
          in_stack_fffffffffffff990 = pSStack_150;
          in_stack_fffffffffffff998 = local_148;
          if (bVar2) {
            std::operator<<((ostream *)local_10,"one of:\n\t\t");
            in_stack_fffffffffffff978 = local_168;
            in_stack_fffffffffffff980 = pSStack_160;
            in_stack_fffffffffffff988 = local_158;
            in_stack_fffffffffffff990 = pSStack_150;
            in_stack_fffffffffffff998 = local_148;
          }
          std::operator<<((ostream *)local_10,local_1a8);
          while (bVar2 = Lib::
                         VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0xc35492), pSVar4 = local_10, bVar2) {
            Lib::
            VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff978);
            std::operator+((char *)in_stack_fffffffffffff988,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff980);
            std::operator<<((ostream *)pSVar4,local_1c8);
            std::__cxx11::string::~string(local_1c8);
            std::__cxx11::string::~string(local_1e8);
          }
          std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_1a8);
        }
        Lib::
        VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~VirtualIterator((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff980);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Stack((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff980);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Stack((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff980);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_370);
        pAVar1 = local_38;
        bVar2 = lineWrapInShowOptions(in_RDI);
        (*pAVar1->_vptr_AbstractOptionValue[7])(pAVar1,local_360,(ulong)bVar2);
        pSVar4 = local_10;
        std::__cxx11::stringstream::str();
        std::operator<<((ostream *)pSVar4,local_390);
        std::__cxx11::string::~string(local_390);
        std::__cxx11::stringstream::~stringstream(local_370);
      }
      std::__cxx11::string::~string(local_58);
    }
    bVar2 = showHelp(in_RDI);
    if (bVar2) {
      std::operator<<((ostream *)local_10,"=========== Usage ==========\n");
      std::operator<<((ostream *)local_10,"Call vampire using\n");
      std::operator<<((ostream *)local_10,"  vampire [options] [problem]\n");
      std::operator<<((ostream *)local_10,"For example,\n");
      std::operator<<((ostream *)local_10,
                      "  vampire --mode casc --include ~/TPTP ~/TPTP/Problems/ALG/ALG150+1.p\n");
      std::operator<<((ostream *)local_10,"=========== Hints ==========\n");
      std::operator<<((ostream *)local_10,"=========== Options ==========\n");
      std::operator<<((ostream *)local_10,"To see a list of all options use\n  --show_options on\n")
      ;
      std::operator<<((ostream *)local_10,
                      "Options will only be displayed for the current mode (Vampire by default)\n");
      std::operator<<((ostream *)local_10," use --mode to change mode\n");
      std::operator<<((ostream *)local_10,"=========== End ==========\n");
    }
    local_391 = showOptions(in_RDI);
    local_392 = showExperimentalOptions(in_RDI);
    if (((local_391 & 1) != 0) || ((bool)local_392)) {
      local_398 = (in_RDI->_mode).super_OptionValue<Shell::Options::Mode>.actualValue;
      LookupWrapper::values(&in_stack_fffffffffffff978->_lookup);
      local_3a4 = 0x10;
      Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::Stack
                (in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
      for (local_3cc = 0; local_3cc <= local_3a4; local_3cc = local_3cc + 1) {
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                  ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff990,
                   (size_t)in_stack_fffffffffffff988);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                  (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::push
                  (in_stack_fffffffffffff990,
                   (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff988);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack
                  ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack
                  ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980);
      }
      while (bVar2 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::hasNext
                               ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0xc359b6),
            bVar2) {
        local_418 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::next
                              ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0xc359dc);
        bVar2 = AbstractOptionValue::inMode
                          (in_stack_fffffffffffff988,
                           (Mode)((ulong)in_stack_fffffffffffff980 >> 0x20));
        if ((bVar2) &&
           ((((local_392 & 1) != 0 && ((local_418->experimental & 1U) != 0)) ||
            (((local_391 & 1) != 0 && ((local_418->experimental & 1U) == 0)))))) {
          local_41c = AbstractOptionValue::getTag(local_418);
          Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                    (&local_3c8,(ulong)local_41c);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::push
                    ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980,
                     (AbstractOptionValue *)in_stack_fffffffffffff978);
        }
      }
      for (local_420 = local_3a4; -1 < local_420; local_420 = local_420 + -1) {
        pSVar4 = Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                           (&local_3c8,(long)local_420);
        bVar2 = Lib::Stack<Shell::Options::AbstractOptionValue_*>::isEmpty(pSVar4);
        if (!bVar2) {
          OptionChoiceValues::operator[][abi_cxx11_
                    ((OptionChoiceValues *)in_stack_fffffffffffff988,
                     (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          std::operator+(in_stack_fffffffffffff9c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980);
          std::__cxx11::string::~string(local_460);
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0,
                     (char *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                     (allocator<char> *)in_stack_fffffffffffff9b0);
          std::allocator<char>::~allocator(&local_4a1);
          psVar7 = local_4a0;
          std::__cxx11::string::length();
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_4c8,(ulong)psVar7);
          poVar5 = (ostream *)
                   std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,local_4a0);
          std::operator<<(poVar5,local_4a0);
          uVar6 = std::__cxx11::string::length();
          if ((uVar6 & 1) == 0) {
            std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar5 = std::operator<<((ostream *)local_10,"*");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          poVar5 = std::operator<<((ostream *)local_10,local_4c8);
          poVar5 = std::operator<<(poVar5,local_440);
          poVar5 = std::operator<<(poVar5,local_4c8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)local_10,local_4a0);
          std::operator<<(poVar5,local_4a0);
          uVar6 = std::__cxx11::string::length();
          if ((uVar6 & 1) == 0) {
            this_00 = (void *)std::ostream::operator<<
                                        (local_10,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar5 = std::operator<<((ostream *)local_10,"*");
            in_stack_fffffffffffff9c8 =
                 (char *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<
                      (in_stack_fffffffffffff9c8,std::endl<char,std::char_traits<char>>);
          }
          in_stack_fffffffffffff9c0 =
               Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                         (&local_3c8,(long)local_420);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                    (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::DArray
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff990,
                     (size_t)in_stack_fffffffffffff988);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::Iterator::Iterator
                    ((Iterator *)in_stack_fffffffffffff980,
                     (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff978);
          it.super_RefIterator._stack = in_stack_fffffffffffff9a0;
          it.super_RefIterator._pointer = (AbstractOptionValue **)in_stack_fffffffffffff998;
          Lib::DArray<Shell::Options::AbstractOptionValue*>::
          initFromIterator<Lib::Stack<Shell::Options::AbstractOptionValue*>::Iterator>
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff990,it,
                     (size_t)in_stack_fffffffffffff988);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::
          sort<Shell::Options::AbstractOptionValueCompatator>(local_500);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::Iterator
                    (local_528,local_500);
          while (in_stack_fffffffffffff9bf =
                      Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::hasNext
                                (local_528), (bool)in_stack_fffffffffffff9bf) {
            in_stack_fffffffffffff9b0 =
                 Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::next(local_528);
            in_stack_fffffffffffff9a0 = local_10;
            bVar2 = lineWrapInShowOptions(in_RDI);
            (*in_stack_fffffffffffff9b0->_vptr_AbstractOptionValue[7])
                      (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a0,(ulong)bVar2);
          }
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::~DArray
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack
                    ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980);
          std::__cxx11::string::~string(local_4c8);
          std::__cxx11::string::~string(local_4a0);
          std::__cxx11::string::~string(local_440);
        }
      }
      Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::~Stack
                (in_stack_fffffffffffff980);
      Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::~VirtualIterator
                ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffff980
                );
    }
  }
  return;
}

Assistant:

void Options::output (std::ostream& str) const
{
  if(printAllTheoryAxioms()){
    cout << "Sorry, not implemented yet!" << endl;

    return;
  }

  if(!explainOption().empty()){
     AbstractOptionValue* option;
     std::string name = explainOption();
     try{
       option = _lookup.findLong(name);
     }
     catch(const ValueNotFoundException&){ 
       try{
         option = _lookup.findShort(name);
       }
       catch(const ValueNotFoundException&){
         option = 0;
       }
     }
     if(!option){ 
       str << name << " not a known option" << endl;
       Stack<std::string> sim_s = getSimilarOptionNames(name,true);
       Stack<std::string> sim_l = getSimilarOptionNames(name,false);
       VirtualIterator<std::string> sit = pvi(concatIters(
           Stack<std::string>::Iterator(sim_s),Stack<std::string>::Iterator(sim_l))); 
        if(sit.hasNext()){
          std::string first = sit.next();
          str << "\tMaybe you meant ";
          if(sit.hasNext()) str << "one of:\n\t\t";
          str << first;
          while(sit.hasNext()){ str << "\n\t\t"+sit.next();}
          str << endl;
        }
     }
     else{
       std::stringstream vs;
       option->output(vs,lineWrapInShowOptions());
       str << vs.str();
     }

  }

  if (showHelp()){
    str << "=========== Usage ==========\n";
    str << "Call vampire using\n";
    str << "  vampire [options] [problem]\n";
    str << "For example,\n";
    str << "  vampire --mode casc --include ~/TPTP ~/TPTP/Problems/ALG/ALG150+1.p\n";

    str << "=========== Hints ==========\n";


    str << "=========== Options ==========\n";
    str << "To see a list of all options use\n  --show_options on\n";
    str << "Options will only be displayed for the current mode (Vampire by default)\n";
    str << " use --mode to change mode\n";
    //str << "By default experimental options will not be shown. To show ";
    //str << "these options use\n  --show_experimental_options on\n";
    str << "=========== End ==========\n";
  }

  bool normalshow = showOptions();
  bool experimental = showExperimentalOptions();

  if(normalshow || experimental) {
    Mode this_mode = _mode.actualValue;
    //str << "=========== Options ==========\n";

    VirtualIterator<AbstractOptionValue*> options = _lookup.values();

    int num_tags = static_cast<int>(OptionTag::LAST_TAG);
    Stack<Stack<AbstractOptionValue*>> groups;
    for(int i=0; i<=num_tags;i++){
        Stack<AbstractOptionValue*> stack;
        groups.push(stack);
    }


    while(options.hasNext()){
      AbstractOptionValue* option = options.next();
      if(option->inMode(this_mode) &&
              ((experimental && option->experimental) ||
               (normalshow && !option->experimental) )){
        unsigned tag = static_cast<unsigned>(option->getTag());
        //option->output(*groups[tag]);
        (groups[tag]).push(option);
      }
    }

    //output them in reverse order
    for(int i=num_tags;i>=0;i--){
      if(groups[i].isEmpty()) continue;
      std::string label = "  "+_tagNames[i]+"  ";
      ASS(label.length() < 40);
      std::string br = "******************************";
      std::string br_gap = br.substr(0,(br.length()-(label.length()/2)));
      str << endl << br << br;
      if (label.length() % 2 == 0) {
        str << endl;
      } else {
        str << "*" << endl;
      }
      str << br_gap << label << br_gap << endl;
      str << br << br;
      if (label.length() % 2 == 0) {
        str << endl << endl;
      } else {
        str << "*" << endl << endl;
      }

      // Sort
      Stack<AbstractOptionValue*> os = groups[i];
      DArray<AbstractOptionValue*> osa;
      osa.initFromIterator(Stack<AbstractOptionValue*>::Iterator(os));
      osa.sort(AbstractOptionValueCompatator());
      DArray<AbstractOptionValue*>::Iterator oit(osa);
      while(oit.hasNext()){
        oit.next()->output(str,lineWrapInShowOptions());
      }
      //str << (*groups[i]).str();
      //delete groups[i];
    }

    //str << "======= End of options =======\n";
  }

}